

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Frame::AddAdditionalData(Frame *this,uint8_t *additional,uint64_t length,uint64_t add_id)

{
  uint8_t *puVar1;
  uint8_t *data;
  uint64_t add_id_local;
  uint64_t length_local;
  uint8_t *additional_local;
  Frame *this_local;
  
  puVar1 = (uint8_t *)operator_new__(length,(nothrow_t *)&std::nothrow);
  if (puVar1 == (uint8_t *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    if (this->additional_ != (uint8_t *)0x0) {
      operator_delete__(this->additional_);
    }
    this->additional_ = puVar1;
    this->additional_length_ = length;
    this->add_id_ = add_id;
    memcpy(this->additional_,additional,this->additional_length_);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Frame::AddAdditionalData(const uint8_t* additional, uint64_t length,
                              uint64_t add_id) {
  uint8_t* const data =
      new (std::nothrow) uint8_t[static_cast<size_t>(length)];  // NOLINT
  if (!data)
    return false;

  delete[] additional_;
  additional_ = data;
  additional_length_ = length;
  add_id_ = add_id;

  memcpy(additional_, additional, static_cast<size_t>(additional_length_));
  return true;
}